

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::StringMaker<wchar_t_const*,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<wchar_t_const*,void> *this,wchar_t *str)

{
  long in_FS_OFFSET;
  allocator local_39;
  wstring local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this == (StringMaker<wchar_t_const*,void> *)0x0) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"{null string}",(allocator *)&local_38);
  }
  else {
    std::__cxx11::wstring::wstring((wstring *)&local_38,(wchar_t *)this,&local_39);
    StringMaker<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
    ::convert(__return_storage_ptr__,&local_38);
    std::__cxx11::wstring::~wstring((wstring *)&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string StringMaker<wchar_t const*>::convert(wchar_t const * str) {
    if (str) {
        return ::Catch::Detail::stringify(std::wstring{ str });
    } else {
        return{ "{null string}" };
    }
}